

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_fails(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  init_process_options("",fail_cb);
  *options.args = "program-that-had-better-not-exist";
  options.file = "program-that-had-better-not-exist";
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  if ((iVar1 != -0xd) && (iVar1 != -2)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,199,"r == UV_ENOENT || r == UV_EACCES");
    abort();
  }
  iVar1 = uv_is_active(&process);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uv_close(&process,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      eval_a = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      eval_b = (int64_t)iVar1;
      if (eval_b == 0) {
        uv_library_shutdown();
        return 0;
      }
      pcVar4 = "uv_loop_close(uv_default_loop())";
      pcVar3 = "0";
      uVar2 = 0xcc;
    }
    else {
      pcVar4 = "0";
      pcVar3 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
      uVar2 = 0xca;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_is_active((uv_handle_t*) &process)";
    uVar2 = 200;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(spawn_fails) {
  int r;

  init_process_options("", fail_cb);
  options.file = options.args[0] = "program-that-had-better-not-exist";

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == UV_ENOENT || r == UV_EACCES);
  ASSERT_OK(uv_is_active((uv_handle_t*) &process));
  uv_close((uv_handle_t*) &process, NULL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}